

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

void __thiscall Assimp::BatchLoader::LoadAll(BatchLoader *this)

{
  ImporterPimpl *pIVar1;
  uint pFlags;
  bool bVar2;
  BatchData *pBVar3;
  Logger *pLVar4;
  aiScene *paVar5;
  _List_node_base *p_Var6;
  char *local_1c8 [4];
  ostream local_1a8 [376];
  
  pBVar3 = this->m_data;
  p_Var6 = (_List_node_base *)&pBVar3->requests;
  while (p_Var6 = (((_List_base<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_> *)
                   &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)&pBVar3->requests) {
    pFlags = *(uint *)&p_Var6[3]._M_next | 0x400;
    if (pBVar3->validate == false) {
      pFlags = *(uint *)&p_Var6[3]._M_next;
    }
    pIVar1 = pBVar3->pImporter->pimpl;
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::operator=(&(pIVar1->mFloatProperties)._M_t,
                (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                 *)&p_Var6[7]._M_prev);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
    ::operator=(&(pIVar1->mIntProperties)._M_t,
                (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *)&p_Var6[4]._M_prev);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&(pIVar1->mStringProperties)._M_t,
                (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&p_Var6[10]._M_prev);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
    ::operator=(&(pIVar1->mMatrixProperties)._M_t,
                (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
                 *)&p_Var6[0xd]._M_prev);
    bVar2 = DefaultLogger::isNullLogger();
    if (!bVar2) {
      pLVar4 = DefaultLogger::get();
      Logger::info(pLVar4,"%%% BEGIN EXTERNAL FILE %%%");
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[7]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [7])"File: ");
      std::operator<<(local_1a8,(string *)(p_Var6 + 1));
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar4,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
    Importer::ReadFile(this->m_data->pImporter,(string *)(p_Var6 + 1),pFlags);
    paVar5 = Importer::GetOrphanedScene(this->m_data->pImporter);
    p_Var6[3]._M_prev = (_List_node_base *)paVar5;
    *(undefined1 *)&p_Var6[4]._M_next = 1;
    pLVar4 = DefaultLogger::get();
    Logger::info(pLVar4,"%%% END EXTERNAL FILE %%%");
    pBVar3 = this->m_data;
  }
  return;
}

Assistant:

void BatchLoader::LoadAll()
{
    // no threaded implementation for the moment
    for ( LoadReqIt it = m_data->requests.begin();it != m_data->requests.end(); ++it) {
        // force validation in debug builds
        unsigned int pp = (*it).flags;
        if ( m_data->validate ) {
            pp |= aiProcess_ValidateDataStructure;
        }

        // setup config properties if necessary
        ImporterPimpl* pimpl = m_data->pImporter->Pimpl();
        pimpl->mFloatProperties  = (*it).map.floats;
        pimpl->mIntProperties    = (*it).map.ints;
        pimpl->mStringProperties = (*it).map.strings;
        pimpl->mMatrixProperties = (*it).map.matrices;

        if (!DefaultLogger::isNullLogger())
        {
            ASSIMP_LOG_INFO("%%% BEGIN EXTERNAL FILE %%%");
            ASSIMP_LOG_INFO_F("File: ", (*it).file);
        }
        m_data->pImporter->ReadFile((*it).file,pp);
        (*it).scene = m_data->pImporter->GetOrphanedScene();
        (*it).loaded = true;

        ASSIMP_LOG_INFO("%%% END EXTERNAL FILE %%%");
    }
}